

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int n)

{
  size_t sVar1;
  int n_00;
  ulong uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  allocator_type local_31;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  testInvariant(this);
  sVar1 = dimension(this);
  marray_detail::Assert<bool>(sVar1 != 0);
  sVar1 = dimension(this);
  if (-(int)sVar1 < n) {
    sVar1 = dimension(this);
    if ((int)sVar1 <= n) goto LAB_001c66b6;
    if (n < 1) {
      sVar1 = dimension(this);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,sVar1,&local_31)
      ;
      uVar2 = 0;
      while( true ) {
        sVar1 = dimension(this);
        if (sVar1 <= uVar2) break;
        sVar1 = dimension(this);
        local_30._M_impl.super__Vector_impl_data._M_start[uVar2] =
             (ulong)(long)((int)uVar2 - n) % sVar1;
        uVar2 = uVar2 + 1;
      }
      View<int,false,std::allocator<unsigned_long>>::
      permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,false,std::allocator<unsigned_long>> *)this,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_30._M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
      goto LAB_001c66d1;
    }
    sVar1 = dimension(this);
    n_00 = n - (int)sVar1;
  }
  else {
LAB_001c66b6:
    sVar1 = dimension(this);
    n_00 = n % (int)sVar1;
  }
  shift(this,n_00);
LAB_001c66d1:
  testInvariant(this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::shift
(
    const int n
) 
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || dimension() != 0);
    if(n <= -static_cast<int>(dimension()) || n >= static_cast<int>(dimension())) {
        shift(n % static_cast<int>(dimension()));
    }
    else {
        if(n > 0) {
            shift(n - static_cast<int>(dimension()));
        }
        else {
            std::vector<std::size_t> p(dimension());
            for(std::size_t j=0; j<dimension(); ++j) {
                p[j] = static_cast<std::size_t>((static_cast<int>(j) - n)) % dimension();
            }
            permute(p.begin());
        }
    }
    testInvariant();
}